

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined4 uVar71;
  undefined4 uVar72;
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  bool bVar85;
  undefined4 uVar86;
  ulong uVar87;
  long lVar88;
  ulong uVar89;
  long lVar90;
  int iVar91;
  ulong uVar92;
  ulong unaff_R12;
  size_t mask;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  bool bVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar108;
  float fVar109;
  vint4 bi;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  vint4 ai;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  float fVar126;
  float fVar127;
  undefined1 auVar125 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar136;
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  uint uVar145;
  undefined1 auVar146 [32];
  uint uVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  uint uVar154;
  undefined1 auVar147 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [244];
  int local_bd4;
  RTCIntersectArguments *local_bd0;
  ulong local_bc8;
  undefined1 local_bc0 [32];
  ulong local_b90;
  ulong local_b88;
  ulong local_b80;
  ulong local_b78;
  ulong *local_b70;
  ulong local_b68;
  float local_b60;
  float local_b5c;
  float local_b58;
  undefined4 local_b54;
  float local_b50;
  undefined4 local_b4c;
  uint local_b48;
  uint local_b44;
  uint local_b40;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  Scene *local_a40;
  undefined1 auStack_a38 [24];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined4 uStack_9e4;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800;
  ulong local_7f8 [249];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar100 = ray->tfar;
    if (0.0 <= fVar100) {
      local_b70 = local_7f8;
      local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0;
      auVar97 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar123._8_4_ = 0x7fffffff;
      auVar123._0_8_ = 0x7fffffff7fffffff;
      auVar123._12_4_ = 0x7fffffff;
      auVar123 = vandps_avx((undefined1  [16])aVar2,auVar123);
      auVar128._8_4_ = 0x219392ef;
      auVar128._0_8_ = 0x219392ef219392ef;
      auVar128._12_4_ = 0x219392ef;
      auVar123 = vcmpps_avx(auVar123,auVar128,1);
      auVar123 = vblendvps_avx((undefined1  [16])aVar2,auVar128,auVar123);
      auVar128 = vrcpps_avx(auVar123);
      fVar109 = auVar128._0_4_;
      auVar119._0_4_ = fVar109 * auVar123._0_4_;
      fVar110 = auVar128._4_4_;
      auVar119._4_4_ = fVar110 * auVar123._4_4_;
      fVar111 = auVar128._8_4_;
      auVar119._8_4_ = fVar111 * auVar123._8_4_;
      fVar112 = auVar128._12_4_;
      auVar119._12_4_ = fVar112 * auVar123._12_4_;
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = &DAT_3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar123 = vsubps_avx(auVar129,auVar119);
      auVar120._0_4_ = fVar109 + fVar109 * auVar123._0_4_;
      auVar120._4_4_ = fVar110 + fVar110 * auVar123._4_4_;
      auVar120._8_4_ = fVar111 + fVar111 * auVar123._8_4_;
      auVar120._12_4_ = fVar112 + fVar112 * auVar123._12_4_;
      uVar86 = *(undefined4 *)&(ray->org).field_0;
      local_a50._4_4_ = uVar86;
      local_a50._0_4_ = uVar86;
      local_a50._8_4_ = uVar86;
      local_a50._12_4_ = uVar86;
      auVar133 = ZEXT1664(local_a50);
      uVar86 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_a60._4_4_ = uVar86;
      local_a60._0_4_ = uVar86;
      local_a60._8_4_ = uVar86;
      local_a60._12_4_ = uVar86;
      auVar135 = ZEXT1664(local_a60);
      uVar86 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_a70._4_4_ = uVar86;
      local_a70._0_4_ = uVar86;
      local_a70._8_4_ = uVar86;
      local_a70._12_4_ = uVar86;
      auVar138 = ZEXT1664(local_a70);
      local_a80 = vshufps_avx(auVar120,auVar120,0);
      auVar147 = ZEXT1664(local_a80);
      auVar123 = vmovshdup_avx(auVar120);
      local_a90 = vshufps_avx(auVar120,auVar120,0x55);
      auVar156 = ZEXT1664(local_a90);
      auVar128 = vshufpd_avx(auVar120,auVar120,1);
      local_aa0 = vshufps_avx(auVar120,auVar120,0xaa);
      auVar122 = ZEXT1664(local_aa0);
      local_b78 = (ulong)(auVar120._0_4_ < 0.0) << 4;
      local_b80 = (ulong)(auVar123._0_4_ < 0.0) << 4 | 0x20;
      local_b88 = (ulong)(auVar128._0_4_ < 0.0) << 4 | 0x40;
      local_b90 = local_b78 ^ 0x10;
      uVar89 = local_b80 ^ 0x10;
      uVar95 = local_b88 ^ 0x10;
      local_ab0 = vshufps_avx(auVar97,auVar97,0);
      auVar125 = ZEXT1664(local_ab0);
      local_ac0 = vshufps_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),0);
      auVar131 = ZEXT1664(local_ac0);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      local_9e0 = vperm2f128_avx(local_a20,mm_lookupmask_ps._0_32_,2);
      auVar98._8_4_ = 0xbf800000;
      auVar98._0_8_ = 0xbf800000bf800000;
      auVar98._12_4_ = 0xbf800000;
      auVar98._16_4_ = 0xbf800000;
      auVar98._20_4_ = 0xbf800000;
      auVar98._24_4_ = 0xbf800000;
      auVar98._28_4_ = 0xbf800000;
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = &DAT_3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar116._16_4_ = 0x3f800000;
      auVar116._20_4_ = 0x3f800000;
      auVar116._24_4_ = 0x3f800000;
      auVar116._28_4_ = 0x3f800000;
      _local_a00 = vblendvps_avx(auVar116,auVar98,local_9e0);
      local_bc8 = uVar95;
      do {
        if (local_b70 == &local_800) {
          return;
        }
        uVar94 = local_b70[-1];
        local_b70 = local_b70 + -1;
        do {
          iVar91 = 6;
          if ((uVar94 & 8) == 0) {
            auVar123 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + local_b78),auVar133._0_16_)
            ;
            auVar97._0_4_ = auVar147._0_4_ * auVar123._0_4_;
            auVar97._4_4_ = auVar147._4_4_ * auVar123._4_4_;
            auVar97._8_4_ = auVar147._8_4_ * auVar123._8_4_;
            auVar97._12_4_ = auVar147._12_4_ * auVar123._12_4_;
            auVar123 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + local_b80),auVar135._0_16_)
            ;
            auVar101._0_4_ = auVar156._0_4_ * auVar123._0_4_;
            auVar101._4_4_ = auVar156._4_4_ * auVar123._4_4_;
            auVar101._8_4_ = auVar156._8_4_ * auVar123._8_4_;
            auVar101._12_4_ = auVar156._12_4_ * auVar123._12_4_;
            auVar123 = vpmaxsd_avx(auVar97,auVar101);
            auVar97 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + local_b88),auVar138._0_16_);
            auVar102._0_4_ = auVar122._0_4_ * auVar97._0_4_;
            auVar102._4_4_ = auVar122._4_4_ * auVar97._4_4_;
            auVar102._8_4_ = auVar122._8_4_ * auVar97._8_4_;
            auVar102._12_4_ = auVar122._12_4_ * auVar97._12_4_;
            auVar97 = vpmaxsd_avx(auVar102,auVar125._0_16_);
            auVar123 = vpmaxsd_avx(auVar123,auVar97);
            auVar97 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + local_b90),auVar133._0_16_);
            auVar103._0_4_ = auVar147._0_4_ * auVar97._0_4_;
            auVar103._4_4_ = auVar147._4_4_ * auVar97._4_4_;
            auVar103._8_4_ = auVar147._8_4_ * auVar97._8_4_;
            auVar103._12_4_ = auVar147._12_4_ * auVar97._12_4_;
            auVar97 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + uVar89),auVar135._0_16_);
            auVar114._0_4_ = auVar156._0_4_ * auVar97._0_4_;
            auVar114._4_4_ = auVar156._4_4_ * auVar97._4_4_;
            auVar114._8_4_ = auVar156._8_4_ * auVar97._8_4_;
            auVar114._12_4_ = auVar156._12_4_ * auVar97._12_4_;
            auVar97 = vpminsd_avx(auVar103,auVar114);
            auVar128 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + uVar95),auVar138._0_16_);
            auVar115._0_4_ = auVar122._0_4_ * auVar128._0_4_;
            auVar115._4_4_ = auVar122._4_4_ * auVar128._4_4_;
            auVar115._8_4_ = auVar122._8_4_ * auVar128._8_4_;
            auVar115._12_4_ = auVar122._12_4_ * auVar128._12_4_;
            auVar128 = vpminsd_avx(auVar115,auVar131._0_16_);
            auVar97 = vpminsd_avx(auVar97,auVar128);
            auVar123 = vpcmpgtd_avx(auVar123,auVar97);
            uVar86 = vmovmskps_avx(auVar123);
            unaff_R12 = (ulong)(byte)((byte)uVar86 ^ 0xf);
          }
          if ((uVar94 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar91 = 4;
            }
            else {
              uVar93 = uVar94 & 0xfffffffffffffff0;
              lVar90 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
                }
              }
              uVar94 = *(ulong *)(uVar93 + lVar90 * 8);
              uVar92 = unaff_R12 - 1 & unaff_R12;
              if (uVar92 != 0) {
                *local_b70 = uVar94;
                lVar90 = 0;
                if (uVar92 != 0) {
                  for (; (uVar92 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
                  }
                }
                uVar87 = uVar92 - 1;
                while( true ) {
                  local_b70 = local_b70 + 1;
                  uVar94 = *(ulong *)(uVar93 + lVar90 * 8);
                  uVar87 = uVar87 & uVar92;
                  if (uVar87 == 0) break;
                  *local_b70 = uVar94;
                  lVar90 = 0;
                  if (uVar87 != 0) {
                    for (; (uVar87 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
                    }
                  }
                  uVar92 = uVar87 - 1;
                }
              }
              iVar91 = 0;
            }
          }
        } while (iVar91 == 0);
        if (iVar91 == 6) {
          local_b68 = (ulong)((uint)uVar94 & 0xf) - 8;
          bVar96 = local_b68 != 0;
          if (bVar96) {
            uVar94 = uVar94 & 0xfffffffffffffff0;
            uVar95 = 0;
            do {
              lVar88 = uVar95 * 0xe0;
              lVar90 = uVar94 + 0xd0 + lVar88;
              local_9c0 = *(undefined8 *)(lVar90 + 0x10);
              uStack_9b8 = *(undefined8 *)(lVar90 + 0x18);
              lVar90 = uVar94 + 0xc0 + lVar88;
              local_9a0 = *(undefined8 *)(lVar90 + 0x10);
              uStack_998 = *(undefined8 *)(lVar90 + 0x18);
              uStack_990 = local_9a0;
              uStack_988 = uStack_998;
              uStack_9b0 = local_9c0;
              uStack_9a8 = uStack_9b8;
              auVar121._16_16_ = *(undefined1 (*) [16])(uVar94 + 0x60 + lVar88);
              auVar121._0_16_ = *(undefined1 (*) [16])(uVar94 + lVar88);
              auVar130._16_16_ = *(undefined1 (*) [16])(uVar94 + 0x70 + lVar88);
              auVar130._0_16_ = *(undefined1 (*) [16])(uVar94 + 0x10 + lVar88);
              auVar134._16_16_ = *(undefined1 (*) [16])(uVar94 + 0x80 + lVar88);
              auVar134._0_16_ = *(undefined1 (*) [16])(uVar94 + 0x20 + lVar88);
              auVar123 = *(undefined1 (*) [16])(uVar94 + 0x30 + lVar88);
              auVar99._16_16_ = auVar123;
              auVar99._0_16_ = auVar123;
              auVar97 = *(undefined1 (*) [16])(uVar94 + 0x40 + lVar88);
              auVar104._16_16_ = auVar97;
              auVar104._0_16_ = auVar97;
              auVar128 = *(undefined1 (*) [16])(uVar94 + 0x50 + lVar88);
              auVar117._16_16_ = auVar128;
              auVar117._0_16_ = auVar128;
              auVar119 = *(undefined1 (*) [16])(uVar94 + 0x90 + lVar88);
              auVar146._16_16_ = auVar119;
              auVar146._0_16_ = auVar119;
              auVar119 = *(undefined1 (*) [16])(uVar94 + 0xa0 + lVar88);
              auVar155._16_16_ = auVar119;
              auVar155._0_16_ = auVar119;
              auVar119 = *(undefined1 (*) [16])(uVar94 + 0xb0 + lVar88);
              auVar157._16_16_ = auVar119;
              auVar157._0_16_ = auVar119;
              local_bc0 = vsubps_avx(auVar121,auVar99);
              local_ae0 = vsubps_avx(auVar130,auVar104);
              auVar98 = vsubps_avx(auVar134,auVar117);
              auVar116 = vsubps_avx(auVar146,auVar121);
              auVar99 = vsubps_avx(auVar155,auVar130);
              auVar104 = vsubps_avx(auVar157,auVar134);
              fVar111 = auVar104._0_4_;
              fVar158 = local_ae0._0_4_;
              fVar7 = auVar104._4_4_;
              fVar160 = local_ae0._4_4_;
              auVar67._4_4_ = fVar160 * fVar7;
              auVar67._0_4_ = fVar158 * fVar111;
              fVar17 = auVar104._8_4_;
              fVar161 = local_ae0._8_4_;
              auVar67._8_4_ = fVar161 * fVar17;
              fVar27 = auVar104._12_4_;
              fVar162 = local_ae0._12_4_;
              auVar67._12_4_ = fVar162 * fVar27;
              fVar37 = auVar104._16_4_;
              fVar163 = local_ae0._16_4_;
              auVar67._16_4_ = fVar163 * fVar37;
              fVar47 = auVar104._20_4_;
              fVar164 = local_ae0._20_4_;
              auVar67._20_4_ = fVar164 * fVar47;
              fVar57 = auVar104._24_4_;
              fVar165 = local_ae0._24_4_;
              auVar67._24_4_ = fVar165 * fVar57;
              auVar67._28_4_ = auVar123._12_4_;
              fVar112 = auVar99._0_4_;
              fVar136 = auVar98._0_4_;
              fVar8 = auVar99._4_4_;
              fVar139 = auVar98._4_4_;
              auVar68._4_4_ = fVar139 * fVar8;
              auVar68._0_4_ = fVar136 * fVar112;
              fVar18 = auVar99._8_4_;
              fVar140 = auVar98._8_4_;
              auVar68._8_4_ = fVar140 * fVar18;
              fVar28 = auVar99._12_4_;
              fVar141 = auVar98._12_4_;
              auVar68._12_4_ = fVar141 * fVar28;
              fVar38 = auVar99._16_4_;
              fVar142 = auVar98._16_4_;
              auVar68._16_4_ = fVar142 * fVar38;
              fVar48 = auVar99._20_4_;
              fVar143 = auVar98._20_4_;
              auVar68._20_4_ = fVar143 * fVar48;
              fVar58 = auVar99._24_4_;
              uVar71 = auVar97._12_4_;
              fVar144 = auVar98._24_4_;
              auVar68._24_4_ = fVar144 * fVar58;
              auVar68._28_4_ = uVar71;
              local_b00 = vsubps_avx(auVar68,auVar67);
              fVar113 = auVar116._0_4_;
              fVar9 = auVar116._4_4_;
              auVar69._4_4_ = fVar139 * fVar9;
              auVar69._0_4_ = fVar136 * fVar113;
              fVar19 = auVar116._8_4_;
              auVar69._8_4_ = fVar140 * fVar19;
              fVar29 = auVar116._12_4_;
              auVar69._12_4_ = fVar141 * fVar29;
              fVar39 = auVar116._16_4_;
              auVar69._16_4_ = fVar142 * fVar39;
              fVar49 = auVar116._20_4_;
              auVar69._20_4_ = fVar143 * fVar49;
              fVar59 = auVar116._24_4_;
              uVar72 = local_b00._28_4_;
              auVar69._24_4_ = fVar144 * fVar59;
              auVar69._28_4_ = uVar72;
              fVar126 = local_bc0._0_4_;
              fVar10 = local_bc0._4_4_;
              auVar70._4_4_ = fVar7 * fVar10;
              auVar70._0_4_ = fVar111 * fVar126;
              fVar20 = local_bc0._8_4_;
              auVar70._8_4_ = fVar17 * fVar20;
              fVar30 = local_bc0._12_4_;
              auVar70._12_4_ = fVar27 * fVar30;
              fVar40 = local_bc0._16_4_;
              auVar70._16_4_ = fVar37 * fVar40;
              fVar50 = local_bc0._20_4_;
              auVar70._20_4_ = fVar47 * fVar50;
              fVar60 = local_bc0._24_4_;
              fVar73 = auVar128._12_4_;
              auVar70._24_4_ = fVar57 * fVar60;
              auVar70._28_4_ = fVar73;
              auVar98 = vsubps_avx(auVar70,auVar69);
              auVar74._4_4_ = fVar8 * fVar10;
              auVar74._0_4_ = fVar112 * fVar126;
              auVar74._8_4_ = fVar18 * fVar20;
              auVar74._12_4_ = fVar28 * fVar30;
              auVar74._16_4_ = fVar38 * fVar40;
              auVar74._20_4_ = fVar48 * fVar50;
              auVar74._24_4_ = fVar58 * fVar60;
              auVar74._28_4_ = uVar72;
              auVar75._4_4_ = fVar160 * fVar9;
              auVar75._0_4_ = fVar158 * fVar113;
              auVar75._8_4_ = fVar161 * fVar19;
              auVar75._12_4_ = fVar162 * fVar29;
              auVar75._16_4_ = fVar163 * fVar39;
              auVar75._20_4_ = fVar164 * fVar49;
              auVar75._24_4_ = fVar165 * fVar59;
              auVar75._28_4_ = local_ae0._28_4_;
              auVar67 = vsubps_avx(auVar75,auVar74);
              uVar86 = *(undefined4 *)&(ray->org).field_0;
              auVar159._4_4_ = uVar86;
              auVar159._0_4_ = uVar86;
              auVar159._8_4_ = uVar86;
              auVar159._12_4_ = uVar86;
              auVar159._16_4_ = uVar86;
              auVar159._20_4_ = uVar86;
              auVar159._24_4_ = uVar86;
              auVar159._28_4_ = uVar86;
              uVar86 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar166._4_4_ = uVar86;
              auVar166._0_4_ = uVar86;
              auVar166._8_4_ = uVar86;
              auVar166._12_4_ = uVar86;
              auVar166._16_4_ = uVar86;
              auVar166._20_4_ = uVar86;
              auVar166._24_4_ = uVar86;
              auVar166._28_4_ = uVar86;
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar167._4_4_ = uVar1;
              auVar167._0_4_ = uVar1;
              auVar167._8_4_ = uVar1;
              auVar167._12_4_ = uVar1;
              auVar167._16_4_ = uVar1;
              auVar167._20_4_ = uVar1;
              auVar167._24_4_ = uVar1;
              auVar167._28_4_ = uVar1;
              fVar100 = (ray->dir).field_0.m128[1];
              auVar68 = vsubps_avx(auVar121,auVar159);
              fVar109 = (ray->dir).field_0.m128[2];
              auVar69 = vsubps_avx(auVar130,auVar166);
              auVar70 = vsubps_avx(auVar134,auVar167);
              fVar127 = auVar70._0_4_;
              fVar11 = auVar70._4_4_;
              auVar76._4_4_ = fVar100 * fVar11;
              auVar76._0_4_ = fVar100 * fVar127;
              fVar21 = auVar70._8_4_;
              auVar76._8_4_ = fVar100 * fVar21;
              fVar31 = auVar70._12_4_;
              auVar76._12_4_ = fVar100 * fVar31;
              fVar41 = auVar70._16_4_;
              auVar76._16_4_ = fVar100 * fVar41;
              fVar51 = auVar70._20_4_;
              auVar76._20_4_ = fVar100 * fVar51;
              fVar61 = auVar70._24_4_;
              auVar76._24_4_ = fVar100 * fVar61;
              auVar76._28_4_ = uVar86;
              fVar108 = auVar69._0_4_;
              fVar12 = auVar69._4_4_;
              auVar77._4_4_ = fVar109 * fVar12;
              auVar77._0_4_ = fVar109 * fVar108;
              fVar22 = auVar69._8_4_;
              auVar77._8_4_ = fVar109 * fVar22;
              fVar32 = auVar69._12_4_;
              auVar77._12_4_ = fVar109 * fVar32;
              fVar42 = auVar69._16_4_;
              auVar77._16_4_ = fVar109 * fVar42;
              fVar52 = auVar69._20_4_;
              auVar77._20_4_ = fVar109 * fVar52;
              fVar62 = auVar69._24_4_;
              auVar77._24_4_ = fVar109 * fVar62;
              auVar77._28_4_ = uVar1;
              auVar69 = vsubps_avx(auVar77,auVar76);
              fVar110 = (ray->dir).field_0.m128[0];
              fVar3 = auVar68._0_4_;
              fVar13 = auVar68._4_4_;
              auVar78._4_4_ = fVar109 * fVar13;
              auVar78._0_4_ = fVar109 * fVar3;
              fVar23 = auVar68._8_4_;
              auVar78._8_4_ = fVar109 * fVar23;
              fVar33 = auVar68._12_4_;
              auVar78._12_4_ = fVar109 * fVar33;
              fVar43 = auVar68._16_4_;
              auVar78._16_4_ = fVar109 * fVar43;
              fVar53 = auVar68._20_4_;
              auVar78._20_4_ = fVar109 * fVar53;
              fVar63 = auVar68._24_4_;
              auVar78._24_4_ = fVar109 * fVar63;
              auVar78._28_4_ = uVar72;
              auVar79._4_4_ = fVar110 * fVar11;
              auVar79._0_4_ = fVar110 * fVar127;
              auVar79._8_4_ = fVar110 * fVar21;
              auVar79._12_4_ = fVar110 * fVar31;
              auVar79._16_4_ = fVar110 * fVar41;
              auVar79._20_4_ = fVar110 * fVar51;
              auVar79._24_4_ = fVar110 * fVar61;
              auVar79._28_4_ = uVar71;
              auVar68 = vsubps_avx(auVar79,auVar78);
              auVar80._4_4_ = fVar110 * fVar12;
              auVar80._0_4_ = fVar110 * fVar108;
              auVar80._8_4_ = fVar110 * fVar22;
              auVar80._12_4_ = fVar110 * fVar32;
              auVar80._16_4_ = fVar110 * fVar42;
              auVar80._20_4_ = fVar110 * fVar52;
              auVar80._24_4_ = fVar110 * fVar62;
              auVar80._28_4_ = uVar71;
              auVar81._4_4_ = fVar100 * fVar13;
              auVar81._0_4_ = fVar100 * fVar3;
              auVar81._8_4_ = fVar100 * fVar23;
              auVar81._12_4_ = fVar100 * fVar33;
              auVar81._16_4_ = fVar100 * fVar43;
              auVar81._20_4_ = fVar100 * fVar53;
              auVar81._24_4_ = fVar100 * fVar63;
              auVar81._28_4_ = fVar73;
              auVar70 = vsubps_avx(auVar81,auVar80);
              fVar4 = auVar67._0_4_;
              fVar14 = auVar67._4_4_;
              fVar24 = auVar67._8_4_;
              fVar34 = auVar67._12_4_;
              fVar44 = auVar67._16_4_;
              fVar54 = auVar67._20_4_;
              fVar64 = auVar67._24_4_;
              fVar5 = auVar98._0_4_;
              fVar15 = auVar98._4_4_;
              fVar25 = auVar98._8_4_;
              fVar35 = auVar98._12_4_;
              fVar45 = auVar98._16_4_;
              fVar55 = auVar98._20_4_;
              fVar65 = auVar98._24_4_;
              fVar6 = local_b00._0_4_;
              fVar16 = local_b00._4_4_;
              fVar26 = local_b00._8_4_;
              fVar36 = local_b00._12_4_;
              fVar46 = local_b00._16_4_;
              fVar56 = local_b00._20_4_;
              fVar66 = local_b00._24_4_;
              auVar118._0_4_ = fVar110 * fVar6 + fVar100 * fVar5 + fVar109 * fVar4;
              auVar118._4_4_ = fVar110 * fVar16 + fVar100 * fVar15 + fVar109 * fVar14;
              auVar118._8_4_ = fVar110 * fVar26 + fVar100 * fVar25 + fVar109 * fVar24;
              auVar118._12_4_ = fVar110 * fVar36 + fVar100 * fVar35 + fVar109 * fVar34;
              auVar118._16_4_ = fVar110 * fVar46 + fVar100 * fVar45 + fVar109 * fVar44;
              auVar118._20_4_ = fVar110 * fVar56 + fVar100 * fVar55 + fVar109 * fVar54;
              auVar118._24_4_ = fVar110 * fVar66 + fVar100 * fVar65 + fVar109 * fVar64;
              auVar118._28_4_ = fVar109 + fVar109 + fVar73;
              auVar105._8_4_ = 0x80000000;
              auVar105._0_8_ = 0x8000000080000000;
              auVar105._12_4_ = 0x80000000;
              auVar105._16_4_ = 0x80000000;
              auVar105._20_4_ = 0x80000000;
              auVar105._24_4_ = 0x80000000;
              auVar105._28_4_ = 0x80000000;
              auVar98 = vandps_avx(auVar118,auVar105);
              uVar145 = auVar98._0_4_;
              auVar132._0_4_ =
                   (float)(uVar145 ^
                          (uint)(fVar113 * auVar69._0_4_ +
                                fVar112 * auVar68._0_4_ + fVar111 * auVar70._0_4_));
              uVar148 = auVar98._4_4_;
              auVar132._4_4_ =
                   (float)(uVar148 ^
                          (uint)(fVar9 * auVar69._4_4_ +
                                fVar8 * auVar68._4_4_ + fVar7 * auVar70._4_4_));
              uVar149 = auVar98._8_4_;
              auVar132._8_4_ =
                   (float)(uVar149 ^
                          (uint)(fVar19 * auVar69._8_4_ +
                                fVar18 * auVar68._8_4_ + fVar17 * auVar70._8_4_));
              uVar150 = auVar98._12_4_;
              auVar132._12_4_ =
                   (float)(uVar150 ^
                          (uint)(fVar29 * auVar69._12_4_ +
                                fVar28 * auVar68._12_4_ + fVar27 * auVar70._12_4_));
              uVar151 = auVar98._16_4_;
              auVar132._16_4_ =
                   (float)(uVar151 ^
                          (uint)(fVar39 * auVar69._16_4_ +
                                fVar38 * auVar68._16_4_ + fVar37 * auVar70._16_4_));
              uVar152 = auVar98._20_4_;
              auVar132._20_4_ =
                   (float)(uVar152 ^
                          (uint)(fVar49 * auVar69._20_4_ +
                                fVar48 * auVar68._20_4_ + fVar47 * auVar70._20_4_));
              uVar153 = auVar98._24_4_;
              auVar132._24_4_ =
                   (float)(uVar153 ^
                          (uint)(fVar59 * auVar69._24_4_ +
                                fVar58 * auVar68._24_4_ + fVar57 * auVar70._24_4_));
              uVar154 = auVar98._28_4_;
              auVar132._28_4_ =
                   (float)(uVar154 ^ (uint)(auVar116._28_4_ + auVar99._28_4_ + auVar104._28_4_));
              auVar137._0_4_ =
                   (float)(uVar145 ^
                          (uint)(auVar69._0_4_ * fVar126 +
                                auVar68._0_4_ * fVar158 + fVar136 * auVar70._0_4_));
              auVar137._4_4_ =
                   (float)(uVar148 ^
                          (uint)(auVar69._4_4_ * fVar10 +
                                auVar68._4_4_ * fVar160 + fVar139 * auVar70._4_4_));
              auVar137._8_4_ =
                   (float)(uVar149 ^
                          (uint)(auVar69._8_4_ * fVar20 +
                                auVar68._8_4_ * fVar161 + fVar140 * auVar70._8_4_));
              auVar137._12_4_ =
                   (float)(uVar150 ^
                          (uint)(auVar69._12_4_ * fVar30 +
                                auVar68._12_4_ * fVar162 + fVar141 * auVar70._12_4_));
              auVar137._16_4_ =
                   (float)(uVar151 ^
                          (uint)(auVar69._16_4_ * fVar40 +
                                auVar68._16_4_ * fVar163 + fVar142 * auVar70._16_4_));
              auVar137._20_4_ =
                   (float)(uVar152 ^
                          (uint)(auVar69._20_4_ * fVar50 +
                                auVar68._20_4_ * fVar164 + fVar143 * auVar70._20_4_));
              auVar137._24_4_ =
                   (float)(uVar153 ^
                          (uint)(auVar69._24_4_ * fVar60 +
                                auVar68._24_4_ * fVar165 + fVar144 * auVar70._24_4_));
              auVar137._28_4_ = (float)(uVar154 ^ (uint)(auVar68._28_4_ + auVar70._28_4_ + -0.0));
              auVar116 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar98 = vcmpps_avx(auVar132,auVar116,5);
              auVar116 = vcmpps_avx(auVar137,auVar116,5);
              auVar98 = vandps_avx(auVar98,auVar116);
              auVar106._8_4_ = 0x7fffffff;
              auVar106._0_8_ = 0x7fffffff7fffffff;
              auVar106._12_4_ = 0x7fffffff;
              auVar106._16_4_ = 0x7fffffff;
              auVar106._20_4_ = 0x7fffffff;
              auVar106._24_4_ = 0x7fffffff;
              auVar106._28_4_ = 0x7fffffff;
              local_920 = vandps_avx(auVar118,auVar106);
              auVar116 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar118,4);
              auVar98 = vandps_avx(auVar98,auVar116);
              auVar107._0_4_ = auVar137._0_4_ + auVar132._0_4_;
              auVar107._4_4_ = auVar137._4_4_ + auVar132._4_4_;
              auVar107._8_4_ = auVar137._8_4_ + auVar132._8_4_;
              auVar107._12_4_ = auVar137._12_4_ + auVar132._12_4_;
              auVar107._16_4_ = auVar137._16_4_ + auVar132._16_4_;
              auVar107._20_4_ = auVar137._20_4_ + auVar132._20_4_;
              auVar107._24_4_ = auVar137._24_4_ + auVar132._24_4_;
              auVar107._28_4_ = auVar137._28_4_ + auVar132._28_4_;
              auVar99 = vcmpps_avx(auVar107,local_920,2);
              auVar116 = vandps_avx(auVar98,auVar99);
              auVar104 = local_a20 & auVar116;
              if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar104 >> 0x7f,0) != '\0') ||
                    (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar104 >> 0xbf,0) != '\0') ||
                  (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar104[0x1f] < '\0') {
                auVar116 = vandps_avx(auVar116,local_a20);
                local_940._0_4_ =
                     (float)(uVar145 ^ (uint)(fVar6 * fVar3 + fVar5 * fVar108 + fVar127 * fVar4));
                local_940._4_4_ =
                     (float)(uVar148 ^ (uint)(fVar16 * fVar13 + fVar15 * fVar12 + fVar11 * fVar14));
                local_940._8_4_ =
                     (float)(uVar149 ^ (uint)(fVar26 * fVar23 + fVar25 * fVar22 + fVar21 * fVar24));
                local_940._12_4_ =
                     (float)(uVar150 ^ (uint)(fVar36 * fVar33 + fVar35 * fVar32 + fVar31 * fVar34));
                local_940._16_4_ =
                     (float)(uVar151 ^ (uint)(fVar46 * fVar43 + fVar45 * fVar42 + fVar41 * fVar44));
                local_940._20_4_ =
                     (float)(uVar152 ^ (uint)(fVar56 * fVar53 + fVar55 * fVar52 + fVar51 * fVar54));
                local_940._24_4_ =
                     (float)(uVar153 ^ (uint)(fVar66 * fVar63 + fVar65 * fVar62 + fVar61 * fVar64));
                local_940._28_4_ =
                     uVar154 ^ (uint)(auVar99._28_4_ + auVar99._28_4_ + auVar98._28_4_);
                fVar100 = (ray->org).field_0.m128[3];
                fVar109 = local_920._0_4_;
                fVar110 = local_920._4_4_;
                auVar82._4_4_ = fVar110 * fVar100;
                auVar82._0_4_ = fVar109 * fVar100;
                fVar111 = local_920._8_4_;
                auVar82._8_4_ = fVar111 * fVar100;
                fVar112 = local_920._12_4_;
                auVar82._12_4_ = fVar112 * fVar100;
                fVar113 = local_920._16_4_;
                auVar82._16_4_ = fVar113 * fVar100;
                fVar126 = local_920._20_4_;
                auVar82._20_4_ = fVar126 * fVar100;
                fVar127 = local_920._24_4_;
                auVar82._24_4_ = fVar127 * fVar100;
                auVar82._28_4_ = fVar100;
                auVar98 = vcmpps_avx(auVar82,local_940,1);
                fVar100 = ray->tfar;
                auVar83._4_4_ = fVar110 * fVar100;
                auVar83._0_4_ = fVar109 * fVar100;
                auVar83._8_4_ = fVar111 * fVar100;
                auVar83._12_4_ = fVar112 * fVar100;
                auVar83._16_4_ = fVar113 * fVar100;
                auVar83._20_4_ = fVar126 * fVar100;
                auVar83._24_4_ = fVar127 * fVar100;
                auVar83._28_4_ = fVar100;
                auVar99 = vcmpps_avx(local_940,auVar83,2);
                auVar98 = vandps_avx(auVar99,auVar98);
                auVar99 = auVar116 & auVar98;
                if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar99 >> 0x7f,0) != '\0') ||
                      (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar99 >> 0xbf,0) != '\0') ||
                    (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar99[0x1f] < '\0') {
                  local_8e0 = vandps_avx(auVar116,auVar98);
                  auVar98 = vsubps_avx(local_920,auVar137);
                  local_980 = vblendvps_avx(auVar132,auVar98,local_9e0);
                  auVar98 = vsubps_avx(local_920,auVar132);
                  local_960 = vblendvps_avx(auVar137,auVar98,local_9e0);
                  local_860[0] = fVar6 * (float)local_a00._0_4_;
                  local_860[1] = fVar16 * (float)local_a00._4_4_;
                  local_860[2] = fVar26 * fStack_9f8;
                  local_860[3] = fVar36 * fStack_9f4;
                  fStack_850 = fVar46 * fStack_9f0;
                  fStack_84c = fVar56 * fStack_9ec;
                  fStack_848 = fVar66 * fStack_9e8;
                  fStack_844 = auVar137._28_4_;
                  local_840[0] = fVar5 * (float)local_a00._0_4_;
                  local_840[1] = fVar15 * (float)local_a00._4_4_;
                  local_840[2] = fVar25 * fStack_9f8;
                  local_840[3] = fVar35 * fStack_9f4;
                  fStack_830 = fVar45 * fStack_9f0;
                  fStack_82c = fVar55 * fStack_9ec;
                  fStack_828 = fVar65 * fStack_9e8;
                  fStack_824 = auVar137._28_4_;
                  auVar98 = vrcpps_avx(local_920);
                  local_820[0] = (float)local_a00._0_4_ * fVar4;
                  local_820[1] = (float)local_a00._4_4_ * fVar14;
                  local_820[2] = fStack_9f8 * fVar24;
                  local_820[3] = fStack_9f4 * fVar34;
                  fStack_810 = fStack_9f0 * fVar44;
                  fStack_80c = fStack_9ec * fVar54;
                  fStack_808 = fStack_9e8 * fVar64;
                  uStack_804 = uStack_9e4;
                  fVar100 = auVar98._0_4_;
                  fVar108 = auVar98._4_4_;
                  auVar84._4_4_ = fVar110 * fVar108;
                  auVar84._0_4_ = fVar109 * fVar100;
                  fVar109 = auVar98._8_4_;
                  auVar84._8_4_ = fVar111 * fVar109;
                  fVar110 = auVar98._12_4_;
                  auVar84._12_4_ = fVar112 * fVar110;
                  fVar111 = auVar98._16_4_;
                  auVar84._16_4_ = fVar113 * fVar111;
                  fVar112 = auVar98._20_4_;
                  auVar84._20_4_ = fVar126 * fVar112;
                  fVar113 = auVar98._24_4_;
                  auVar84._24_4_ = fVar127 * fVar113;
                  auVar84._28_4_ = uStack_9e4;
                  auVar124._8_4_ = 0x3f800000;
                  auVar124._0_8_ = &DAT_3f8000003f800000;
                  auVar124._12_4_ = 0x3f800000;
                  auVar124._16_4_ = 0x3f800000;
                  auVar124._20_4_ = 0x3f800000;
                  auVar124._24_4_ = 0x3f800000;
                  auVar124._28_4_ = 0x3f800000;
                  auVar98 = vsubps_avx(auVar124,auVar84);
                  fVar100 = fVar100 + fVar100 * auVar98._0_4_;
                  fVar108 = fVar108 + fVar108 * auVar98._4_4_;
                  fVar109 = fVar109 + fVar109 * auVar98._8_4_;
                  fVar110 = fVar110 + fVar110 * auVar98._12_4_;
                  fVar111 = fVar111 + fVar111 * auVar98._16_4_;
                  fVar112 = fVar112 + fVar112 * auVar98._20_4_;
                  fVar113 = fVar113 + fVar113 * auVar98._24_4_;
                  local_880._4_4_ = fVar108 * local_940._4_4_;
                  local_880._0_4_ = fVar100 * local_940._0_4_;
                  local_880._8_4_ = fVar109 * local_940._8_4_;
                  local_880._12_4_ = fVar110 * local_940._12_4_;
                  local_880._16_4_ = fVar111 * local_940._16_4_;
                  local_880._20_4_ = fVar112 * local_940._20_4_;
                  local_880._24_4_ = fVar113 * local_940._24_4_;
                  local_880._28_4_ = auVar98._28_4_;
                  auStack_a38 = auVar67._8_24_;
                  local_a40 = context->scene;
                  local_8c0._4_4_ = local_980._4_4_ * fVar108;
                  local_8c0._0_4_ = local_980._0_4_ * fVar100;
                  local_8c0._8_4_ = local_980._8_4_ * fVar109;
                  local_8c0._12_4_ = local_980._12_4_ * fVar110;
                  local_8c0._16_4_ = local_980._16_4_ * fVar111;
                  local_8c0._20_4_ = local_980._20_4_ * fVar112;
                  local_8c0._24_4_ = local_980._24_4_ * fVar113;
                  local_8c0._28_4_ = local_980._28_4_;
                  local_8a0[0] = local_960._0_4_ * fVar100;
                  local_8a0[1] = local_960._4_4_ * fVar108;
                  local_8a0[2] = local_960._8_4_ * fVar109;
                  local_8a0[3] = local_960._12_4_ * fVar110;
                  fStack_890 = local_960._16_4_ * fVar111;
                  fStack_88c = local_960._20_4_ * fVar112;
                  fStack_888 = local_960._24_4_ * fVar113;
                  uStack_884 = local_960._28_4_;
                  uVar86 = vmovmskps_avx(local_8e0);
                  uVar93 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar86);
                  do {
                    local_bc0._0_8_ = uVar93;
                    uVar92 = 0;
                    if (uVar93 != 0) {
                      for (; (uVar93 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                      }
                    }
                    local_b00._0_8_ = uVar92;
                    local_b48 = *(uint *)((long)&local_9a0 + uVar92 * 4);
                    lVar90 = *(long *)(*(long *)((long)local_a40 + 0x1e8) + (ulong)local_b48 * 8);
                    local_ae0._0_8_ = lVar90;
                    if ((*(uint *)(lVar90 + 0x34) & ray->mask) == 0) {
                      local_bc0._0_8_ = uVar93 ^ 1L << (uVar92 & 0x3f);
                      bVar85 = true;
                    }
                    else {
                      local_bd0 = context->args;
                      if ((local_bd0->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar90 + 0x48) == 0)) {
                        bVar85 = false;
                      }
                      else {
                        local_b54 = *(undefined4 *)(local_8c0 + uVar92 * 4);
                        local_b50 = local_8a0[uVar92];
                        local_b30.context = context->user;
                        local_b4c = *(undefined4 *)((long)&local_9c0 + uVar92 * 4);
                        local_b60 = local_860[uVar92];
                        local_b5c = local_840[uVar92];
                        local_b58 = local_820[uVar92];
                        local_b44 = (local_b30.context)->instID[0];
                        local_b40 = (local_b30.context)->instPrimID[0];
                        fVar100 = ray->tfar;
                        ray->tfar = *(float *)(local_880 + uVar92 * 4);
                        local_bd4 = -1;
                        local_b30.valid = &local_bd4;
                        local_b30.geometryUserPtr = *(void **)(lVar90 + 0x18);
                        local_b30.hit = (RTCHitN *)&local_b60;
                        local_b30.N = 1;
                        local_b30.ray = (RTCRayN *)ray;
                        if ((*(code **)(lVar90 + 0x48) == (code *)0x0) ||
                           ((**(code **)(lVar90 + 0x48))(&local_b30), *local_b30.valid != 0)) {
                          if (local_bd0->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_bd0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               ((*(byte *)(local_ae0._0_8_ + 0x3e) & 0x40) != 0)) {
                              (*local_bd0->filter)(&local_b30);
                            }
                            if (*local_b30.valid == 0) goto LAB_002dbe79;
                          }
                          bVar85 = false;
                        }
                        else {
LAB_002dbe79:
                          ray->tfar = fVar100;
                          local_bc0._0_8_ = local_bc0._0_8_ ^ 1L << (local_b00._0_8_ & 0x3f);
                          bVar85 = true;
                        }
                      }
                    }
                    iVar91 = 0;
                    if (!bVar85) {
                      auVar133 = ZEXT1664(local_a50);
                      auVar135 = ZEXT1664(local_a60);
                      auVar138 = ZEXT1664(local_a70);
                      auVar147 = ZEXT1664(local_a80);
                      auVar156 = ZEXT1664(local_a90);
                      auVar122 = ZEXT1664(local_aa0);
                      auVar125 = ZEXT1664(local_ab0);
                      auVar131 = ZEXT1664(local_ac0);
                      uVar95 = local_bc8;
                      if (bVar96) {
                        ray->tfar = -INFINITY;
                        iVar91 = 3;
                      }
                      goto LAB_002dbf23;
                    }
                    uVar93 = local_bc0._0_8_;
                  } while (local_bc0._0_8_ != 0);
                }
              }
              uVar95 = uVar95 + 1;
              bVar96 = uVar95 < local_b68;
            } while (uVar95 != local_b68);
            auVar133 = ZEXT1664(local_a50);
            auVar135 = ZEXT1664(local_a60);
            auVar138 = ZEXT1664(local_a70);
            auVar147 = ZEXT1664(local_a80);
            auVar156 = ZEXT1664(local_a90);
            auVar122 = ZEXT1664(local_aa0);
            auVar125 = ZEXT1664(local_ab0);
            auVar131 = ZEXT1664(local_ac0);
            uVar95 = local_bc8;
          }
          iVar91 = 0;
        }
LAB_002dbf23:
      } while (iVar91 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }